

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_cb.cpp
# Opt level: O3

void ucnv_cbToUWriteSub_63(UConverterToUnicodeArgs *args,int32_t offsetIndex,UErrorCode *err)

{
  UConverter *cnv;
  UChar *uchars;
  
  cnv = args->converter;
  if ((cnv->invalidCharLength == '\x01') && (cnv->subChar1 != '\0')) {
    if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
      uchars = &ucnv_cbToUWriteSub_63::kSubstituteChar1;
LAB_001b6641:
      ucnv_toUWriteUChars_63
                (cnv,uchars,1,&args->target,args->targetLimit,&args->offsets,offsetIndex,err);
      return;
    }
  }
  else if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
    uchars = &ucnv_cbToUWriteSub_63::kSubstituteChar;
    goto LAB_001b6641;
  }
  return;
}

Assistant:

U_CAPI void  U_EXPORT2
ucnv_cbToUWriteSub (UConverterToUnicodeArgs *args,
                         int32_t offsetIndex,
                       UErrorCode * err)
{
    static const UChar kSubstituteChar1 = 0x1A, kSubstituteChar = 0xFFFD;

    /* could optimize this case, just one uchar */
    if(args->converter->invalidCharLength == 1 && args->converter->subChar1 != 0) {
        ucnv_cbToUWriteUChars(args, &kSubstituteChar1, 1, offsetIndex, err);
    } else {
        ucnv_cbToUWriteUChars(args, &kSubstituteChar, 1, offsetIndex, err);
    }
}